

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

RsElseClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RsElseClauseSyntax,slang::parsing::Token,slang::syntax::RsProdItemSyntax&>
          (BumpAllocator *this,Token *args,RsProdItemSyntax *args_1)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  RsElseClauseSyntax *pRVar6;
  
  pRVar6 = (RsElseClauseSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RsElseClauseSyntax *)this->endPtr < pRVar6 + 1) {
    pRVar6 = (RsElseClauseSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pRVar6 + 1);
  }
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pRVar6->super_SyntaxNode).kind = RsElseClause;
  (pRVar6->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pRVar6->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pRVar6->keyword).kind = TVar2;
  (pRVar6->keyword).field_0x2 = uVar3;
  (pRVar6->keyword).numFlags = (NumericTokenFlags)NVar4.raw;
  (pRVar6->keyword).rawLen = uVar5;
  (pRVar6->keyword).info = pIVar1;
  (pRVar6->item).ptr = args_1;
  (args_1->super_RsProdSyntax).super_SyntaxNode.parent = &pRVar6->super_SyntaxNode;
  return pRVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }